

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeAddedConstants.cpp
# Opt level: O0

void __thiscall
wasm::OptimizeAddedConstants::doWalkFunction(OptimizeAddedConstants *this,Function *func)

{
  bool bVar1;
  PassOptions *pPVar2;
  pointer pLVar3;
  unique_ptr<wasm::LocalGraph,_std::default_delete<wasm::LocalGraph>_> local_20;
  Function *local_18;
  Function *func_local;
  OptimizeAddedConstants *this_local;
  
  local_18 = func;
  func_local = (Function *)this;
  pPVar2 = Pass::getPassOptions((Pass *)this);
  if ((pPVar2->lowMemoryUnused & 1U) == 0) {
    __assert_fail("getPassOptions().lowMemoryUnused",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/OptimizeAddedConstants.cpp"
                  ,0x121,"void wasm::OptimizeAddedConstants::doWalkFunction(Function *)");
  }
  while( true ) {
    this->propagated = false;
    std::
    map<wasm::LocalSet_*,_unsigned_int,_std::less<wasm::LocalSet_*>,_std::allocator<std::pair<wasm::LocalSet_*const,_unsigned_int>_>_>
    ::clear(&this->helperIndexes);
    std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>::
    clear(&this->propagatable);
    if ((this->propagate & 1U) != 0) {
      std::make_unique<wasm::LocalGraph,wasm::Function*&>((Function **)&local_20);
      std::unique_ptr<wasm::LocalGraph,_std::default_delete<wasm::LocalGraph>_>::operator=
                (&this->localGraph,&local_20);
      std::unique_ptr<wasm::LocalGraph,_std::default_delete<wasm::LocalGraph>_>::~unique_ptr
                (&local_20);
      pLVar3 = std::unique_ptr<wasm::LocalGraph,_std::default_delete<wasm::LocalGraph>_>::operator->
                         (&this->localGraph);
      LocalGraph::computeSetInfluences(pLVar3);
      pLVar3 = std::unique_ptr<wasm::LocalGraph,_std::default_delete<wasm::LocalGraph>_>::operator->
                         (&this->localGraph);
      LocalGraph::computeSSAIndexes(pLVar3);
      findPropagatable(this);
    }
    Walker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>
    ::doWalkFunction(&(this->
                      super_WalkerPass<wasm::PostWalker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>_>
                      ).
                      super_PostWalker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>
                      .
                      super_Walker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>
                     ,local_18);
    bVar1 = std::
            map<wasm::LocalSet_*,_unsigned_int,_std::less<wasm::LocalSet_*>,_std::allocator<std::pair<wasm::LocalSet_*const,_unsigned_int>_>_>
            ::empty(&this->helperIndexes);
    if (!bVar1) {
      createHelperIndexes(this);
    }
    if ((this->propagated & 1U) == 0) break;
    cleanUpAfterPropagation(this);
  }
  return;
}

Assistant:

void doWalkFunction(Function* func) {
    // This pass is only valid under the assumption of unused low memory.
    assert(getPassOptions().lowMemoryUnused);
    // Multiple passes may be needed if we have x + 4 + 8 etc. (nested structs
    // in C can cause this, but it's rare). Note that we only need that for the
    // propagation case (as 4 + 8 would be optimized directly if it were
    // adjacent).
    while (1) {
      propagated = false;
      helperIndexes.clear();
      propagatable.clear();
      if (propagate) {
        localGraph = std::make_unique<LocalGraph>(func);
        localGraph->computeSetInfluences();
        localGraph->computeSSAIndexes();
        findPropagatable();
      }
      super::doWalkFunction(func);
      if (!helperIndexes.empty()) {
        createHelperIndexes();
      }
      if (propagated) {
        cleanUpAfterPropagation();
      } else {
        return;
      }
    }
  }